

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

bool __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char32_t>
::iterator::operator==(iterator *this,iterator *other)

{
  bool bVar1;
  bool local_22;
  iterator *other_local;
  iterator *this_local;
  
  bVar1 = done(this);
  if ((bVar1) && (bVar1 = done(other), bVar1)) {
    return true;
  }
  bVar1 = std::operator==(&this->first_,&other->first_);
  local_22 = false;
  if (bVar1) {
    bVar1 = std::operator==(&this->last_,&other->last_);
    local_22 = false;
    if ((bVar1) && (local_22 = false, this->idx_ == other->idx_)) {
      local_22 = detail::operator==(&this->next_chars_,&other->next_chars_);
    }
  }
  return local_22;
}

Assistant:

bool operator==(const iterator& other) const
        {
            return (done() && other.done()) ||
                    (first_ == other.first_ &&
                    last_ == other.last_ &&
                    idx_ == other.idx_ &&
                    next_chars_ == other.next_chars_);
        }